

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O2

bool __thiscall IntElemBoundsImp<0,_0,_0>::propagate(IntElemBoundsImp<0,_0,_0> *this)

{
  BoolView *this_00;
  IntView<0> *pIVar1;
  IntView<0> *pIVar2;
  bool bVar3;
  bool bVar4;
  Lit LVar5;
  int iVar6;
  undefined4 uVar7;
  int iVar8;
  long lVar9;
  Clause *pCVar10;
  Reason r;
  Lit *pLVar11;
  anon_union_8_2_743a5d44_for_Reason_0 r_00;
  IntVar *pIVar12;
  _Vector_base<Lit,_std::allocator<Lit>_> *this_01;
  uint i;
  ulong uVar13;
  IntVar *pIVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  uint i_1;
  Clause *unaff_R15;
  initializer_list<Lit> __l;
  initializer_list<Lit> __l_00;
  initializer_list<Lit> __l_01;
  initializer_list<Lit> __l_02;
  initializer_list<Lit> __l_03;
  initializer_list<Lit> __l_04;
  initializer_list<Lit> __l_05;
  int64_t new_m;
  vector<Lit,_std::allocator<Lit>_> expl;
  int local_124;
  long local_118;
  _Vector_base<Lit,_std::allocator<Lit>_> local_108;
  _Vector_base<Lit,_std::allocator<Lit>_> local_f0;
  _Vector_base<Lit,_std::allocator<Lit>_> local_d8;
  _Vector_base<Lit,_std::allocator<Lit>_> local_c0;
  _Vector_base<Lit,_std::allocator<Lit>_> local_a8;
  _Vector_base<Lit,_std::allocator<Lit>_> local_90;
  _Vector_base<Lit,_std::allocator<Lit>_> local_78;
  _Vector_base<Lit,_std::allocator<Lit>_> local_60;
  _Vector_base<Lit,_std::allocator<Lit>_> local_48;
  
  this_00 = &this->b;
  if ((sat.assigns.data[(uint)(this->b).v] != '\0') && (bVar3 = BoolView::isFalse(this_00), bVar3))
  {
    Tchar::operator=(&(this->super_Propagator).satisfied,'\x01');
    unaff_R15 = (Clause *)0x1;
    goto LAB_001844f7;
  }
  if ((this->is_fixed).v == '\0') {
    if (sat.assigns.data[(uint)(this->b).v] == '\0') {
      expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      pIVar1 = &this->x;
      bVar18 = false;
      bVar3 = false;
      for (uVar15 = 0; uVar13 = (ulong)uVar15, uVar15 <= (this->a).sz; uVar15 = uVar15 + 1) {
        bVar4 = IntView<0>::indomain(pIVar1,uVar13);
        if (bVar4) {
          pIVar12 = (this->y).var;
          unaff_R15 = (Clause *)0x0;
          pIVar14 = (this->a).data[uVar13].var;
          if ((pIVar12->max).v < (pIVar14->min).v) {
            if (!bVar18) {
              iVar8 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[9])(pIVar12);
              new_m = CONCAT44(new_m._4_4_,iVar8);
              std::vector<Lit,_std::allocator<Lit>_>::emplace_back<Lit>(&expl,(Lit *)&new_m);
              pIVar14 = (this->a).data[uVar13].var;
            }
            iVar8 = (*(pIVar14->super_Var).super_Branching._vptr_Branching[8])();
            new_m = CONCAT44(new_m._4_4_,iVar8);
            std::vector<Lit,_std::allocator<Lit>_>::emplace_back<Lit>(&expl,(Lit *)&new_m);
            bVar18 = true;
          }
          else {
            if ((pIVar12->min).v <= (pIVar14->max).v) break;
            if (!bVar3) {
              iVar8 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[8])(pIVar12);
              new_m = CONCAT44(new_m._4_4_,iVar8);
              std::vector<Lit,_std::allocator<Lit>_>::emplace_back<Lit>(&expl,(Lit *)&new_m);
              pIVar14 = (this->a).data[uVar13].var;
            }
            iVar8 = (*(pIVar14->super_Var).super_Branching._vptr_Branching[9])();
            new_m = CONCAT44(new_m._4_4_,iVar8);
            std::vector<Lit,_std::allocator<Lit>_>::emplace_back<Lit>(&expl,(Lit *)&new_m);
            bVar3 = true;
          }
        }
        else {
          iVar8 = (*(pIVar1->var->super_Var).super_Branching._vptr_Branching[0xd])
                            (pIVar1->var,uVar13,1);
          new_m = CONCAT44(new_m._4_4_,iVar8);
          std::vector<Lit,_std::allocator<Lit>_>::emplace_back<Lit>(&expl,(Lit *)&new_m);
        }
      }
      lVar9 = (long)(pIVar1->var->max).v;
      if (lVar9 < (long)uVar13) {
        std::vector<Lit,_std::allocator<Lit>_>::vector
                  ((vector<Lit,_std::allocator<Lit>_> *)&local_108,&expl);
        r.field_0 = (anon_union_8_2_743a5d44_for_Reason_0)
                    Reason_new((vector<Lit,_std::allocator<Lit>_> *)&local_108);
        std::_Vector_base<Lit,_std::allocator<Lit>_>::~_Vector_base(&local_108);
        bVar3 = BoolView::setVal(this_00,false,r);
        unaff_R15 = (Clause *)(ulong)bVar3;
      }
      std::_Vector_base<Lit,_std::allocator<Lit>_>::~_Vector_base
                (&expl.super__Vector_base<Lit,_std::allocator<Lit>_>);
      if (lVar9 < (long)uVar13) goto LAB_001844f7;
    }
    else {
      pIVar1 = &this->x;
      lVar9 = 0;
      for (uVar13 = 0; uVar13 < (this->a).sz; uVar13 = uVar13 + 1) {
        bVar3 = IntView<0>::indomain(pIVar1,uVar13);
        if (bVar3) {
          if ((((this->y).var)->max).v <
              *(int *)(*(long *)((long)&((this->a).data)->var + lVar9) + 0xc)) {
            LVar5 = BoolView::getValLit(this_00);
            expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                         super__Vector_impl_data._M_start._4_4_,LVar5.x);
            uVar7 = (**(code **)(**(long **)((long)&((this->a).data)->var + lVar9) + 0x40))();
            expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(uVar7,expl.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                               _M_impl.super__Vector_impl_data._M_start._0_4_);
            iVar8 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
            expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)CONCAT44(expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                          .super__Vector_impl_data._M_finish._4_4_,iVar8);
            __l_00._M_len = 3;
            __l_00._M_array = (iterator)&expl;
            std::vector<Lit,_std::allocator<Lit>_>::vector
                      ((vector<Lit,_std::allocator<Lit>_> *)&local_d8,__l_00,
                       (allocator_type *)&new_m);
            pCVar10 = Reason_new((vector<Lit,_std::allocator<Lit>_> *)&local_d8);
            std::_Vector_base<Lit,_std::allocator<Lit>_>::~_Vector_base(&local_d8);
            bVar3 = IntView<0>::indomain(pIVar1,uVar13);
            if (bVar3) {
              unaff_R15 = (Clause *)0x0;
              if (so.lazy == false) {
                pCVar10 = unaff_R15;
              }
              iVar8 = (*(pIVar1->var->super_Var).super_Branching._vptr_Branching[0x11])
                                (pIVar1->var,uVar13,pCVar10,1);
              if ((char)iVar8 == '\0') goto LAB_001844f7;
            }
          }
          if (*(int *)(*(long *)((long)&((this->a).data)->var + lVar9) + 0x10) <
              (((this->y).var)->min).v) {
            LVar5 = BoolView::getValLit(this_00);
            expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                         super__Vector_impl_data._M_start._4_4_,LVar5.x);
            uVar7 = (**(code **)(**(long **)((long)&((this->a).data)->var + lVar9) + 0x48))();
            expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(uVar7,expl.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                               _M_impl.super__Vector_impl_data._M_start._0_4_);
            iVar8 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
            expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)CONCAT44(expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                          .super__Vector_impl_data._M_finish._4_4_,iVar8);
            __l_01._M_len = 3;
            __l_01._M_array = (iterator)&expl;
            std::vector<Lit,_std::allocator<Lit>_>::vector
                      ((vector<Lit,_std::allocator<Lit>_> *)&local_f0,__l_01,
                       (allocator_type *)&new_m);
            pCVar10 = Reason_new((vector<Lit,_std::allocator<Lit>_> *)&local_f0);
            std::_Vector_base<Lit,_std::allocator<Lit>_>::~_Vector_base(&local_f0);
            bVar3 = IntView<0>::indomain(pIVar1,uVar13);
            if (bVar3) {
              unaff_R15 = (Clause *)0x0;
              if (so.lazy == false) {
                pCVar10 = (Clause *)0x0;
              }
              iVar8 = (*(pIVar1->var->super_Var).super_Branching._vptr_Branching[0x11])
                                (pIVar1->var,uVar13,pCVar10,1);
              if ((char)iVar8 == '\0') goto LAB_001844f7;
            }
          }
        }
        lVar9 = lVar9 + 0x10;
      }
    }
    if (this->no_min_support != true) {
LAB_00184348:
      unaff_R15 = (Clause *)0x1;
      if (this->no_max_support != true) goto LAB_001844f7;
      local_124 = -1;
      iVar8 = (((this->y).var)->max).v;
      new_m = -0x80000000;
      local_118 = -0x80000000;
      lVar9 = 0;
      for (uVar13 = 0; uVar13 < (this->a).sz; uVar13 = uVar13 + 1) {
        bVar3 = IntView<0>::indomain(&this->x,uVar13);
        if (bVar3) {
          iVar6 = *(int *)(*(long *)((long)&((this->a).data)->var + lVar9) + 0x10);
          lVar17 = (long)iVar6;
          if ((local_118 < lVar17) &&
             (local_124 = (int)uVar13, local_118 = lVar17, new_m = lVar17, iVar8 <= iVar6)) break;
        }
        lVar9 = lVar9 + 0x10;
      }
      Tint::operator=(&this->max_support,local_124);
      pIVar12 = (this->y).var;
      if (local_118 < (pIVar12->max).v) {
        expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data._M_finish
             = (pointer)&new_m;
        if (sat.assigns.data[(uint)(this->b).v] == '\0') {
          if (local_118 < (pIVar12->min).v) {
            expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)this;
            r_00._pt = propagate::anon_class_16_2_f8370e7b::operator()
                                 ((anon_class_16_2_f8370e7b *)&expl);
            iVar8 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
            goto LAB_00184485;
          }
        }
        else {
          expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)this;
          pCVar10 = propagate::anon_class_16_2_f8370e7b::operator()
                              ((anon_class_16_2_f8370e7b *)&expl);
          LVar5 = BoolView::getValLit(this_00);
          pLVar11 = Clause::operator[](pCVar10,1);
          pLVar11->x = LVar5.x;
          pIVar12 = (this->y).var;
          iVar8 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[0xf])
                            (pIVar12,new_m,pCVar10,1);
          if ((char)iVar8 == '\0') goto LAB_001844f4;
        }
      }
      this->no_max_support = false;
      goto LAB_001844f7;
    }
    lVar9 = 0x7fffffffffffffff;
    iVar8 = (((this->y).var)->min).v;
    new_m = 0x7fffffffffffffff;
    local_118._0_4_ = -1;
    lVar17 = 0;
    for (uVar13 = 0; lVar16 = lVar9, uVar13 < (this->a).sz; uVar13 = uVar13 + 1) {
      bVar3 = IntView<0>::indomain(&this->x,uVar13);
      if (bVar3) {
        iVar6 = *(int *)(*(long *)((long)&((this->a).data)->var + lVar17) + 0xc);
        lVar16 = (long)iVar6;
        if ((lVar16 < lVar9) &&
           (local_118._0_4_ = (int)uVar13, lVar9 = lVar16, new_m = lVar16, iVar6 <= iVar8)) break;
      }
      lVar17 = lVar17 + 0x10;
    }
    Tint::operator=(&this->min_support,(int)local_118);
    pIVar12 = (this->y).var;
    if (lVar16 <= (pIVar12->min).v) {
LAB_00184344:
      this->no_min_support = false;
      goto LAB_00184348;
    }
    expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)&new_m;
    if (sat.assigns.data[(uint)(this->b).v] != '\0') {
      expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)this;
      pCVar10 = propagate::anon_class_16_2_f8370e7b::operator()((anon_class_16_2_f8370e7b *)&expl);
      LVar5 = BoolView::getValLit(this_00);
      pLVar11 = Clause::operator[](pCVar10,1);
      pLVar11->x = LVar5.x;
      pIVar12 = (this->y).var;
      iVar8 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[0xe])(pIVar12,new_m,pCVar10,1);
      if ((char)iVar8 == '\0') goto LAB_001844f4;
      goto LAB_00184344;
    }
    expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)this;
    if (lVar16 <= (pIVar12->max).v) goto LAB_00184344;
    r_00._pt = propagate::anon_class_16_2_f8370e7b::operator()((anon_class_16_2_f8370e7b *)&expl);
    iVar8 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
LAB_00184485:
    pLVar11 = Clause::operator[](r_00._pt,1);
    pLVar11->x = iVar8;
  }
  else {
    iVar8 = (this->fixed_index).v;
    lVar9 = (long)iVar8;
    if ((lVar9 < 0) || ((int)(this->a).sz <= iVar8)) {
      iVar8 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
      bVar3 = BoolView::setVal(this_00,false,(Reason)((long)iVar8 * 4 + 2));
      return bVar3;
    }
    pIVar2 = (this->a).data;
    pIVar1 = pIVar2 + lVar9;
    pIVar12 = pIVar2[lVar9].var;
    iVar8 = (pIVar12->min).v;
    if (sat.assigns.data[(uint)(this->b).v] != '\0') {
      pIVar14 = (this->y).var;
      iVar6 = (pIVar14->min).v;
      if (iVar8 <= iVar6) {
LAB_00184154:
        if (iVar8 < iVar6) {
          if (so.lazy == true) {
            LVar5 = BoolView::getValLit(this_00);
            expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                         super__Vector_impl_data._M_start._4_4_,LVar5.x);
            iVar8 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
            expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(iVar8,expl.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                               _M_impl.super__Vector_impl_data._M_start._0_4_);
            iVar8 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
            expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)CONCAT44(expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                          .super__Vector_impl_data._M_finish._4_4_,iVar8);
            __l_03._M_len = 3;
            __l_03._M_array = (iterator)&expl;
            std::vector<Lit,_std::allocator<Lit>_>::vector
                      ((vector<Lit,_std::allocator<Lit>_> *)&local_60,__l_03,
                       (allocator_type *)&new_m);
            pCVar10 = Reason_new((vector<Lit,_std::allocator<Lit>_> *)&local_60);
            std::_Vector_base<Lit,_std::allocator<Lit>_>::~_Vector_base(&local_60);
            pIVar12 = pIVar1->var;
          }
          else {
            pCVar10 = (Clause *)0x0;
          }
          iVar8 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[0xe])
                            (pIVar12,(long)iVar6,pCVar10,1);
          if ((char)iVar8 == '\0') goto LAB_001844f4;
          pIVar12 = pIVar1->var;
          pIVar14 = (this->y).var;
        }
        iVar8 = (pIVar12->max).v;
        iVar6 = (pIVar14->max).v;
        if (iVar8 < iVar6) {
          if (so.lazy == true) {
            LVar5 = BoolView::getValLit(this_00);
            expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                         super__Vector_impl_data._M_start._4_4_,LVar5.x);
            iVar6 = (*(pIVar1->var->super_Var).super_Branching._vptr_Branching[9])();
            expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(iVar6,expl.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                               _M_impl.super__Vector_impl_data._M_start._0_4_);
            iVar6 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
            expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)CONCAT44(expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                          .super__Vector_impl_data._M_finish._4_4_,iVar6);
            __l_04._M_len = 3;
            __l_04._M_array = (iterator)&expl;
            std::vector<Lit,_std::allocator<Lit>_>::vector
                      ((vector<Lit,_std::allocator<Lit>_> *)&local_78,__l_04,
                       (allocator_type *)&new_m);
            pCVar10 = Reason_new((vector<Lit,_std::allocator<Lit>_> *)&local_78);
            std::_Vector_base<Lit,_std::allocator<Lit>_>::~_Vector_base(&local_78);
            pIVar14 = (this->y).var;
          }
          else {
            pCVar10 = (Clause *)0x0;
          }
          iVar8 = (*(pIVar14->super_Var).super_Branching._vptr_Branching[0xf])
                            (pIVar14,(long)iVar8,pCVar10,1);
          if ((char)iVar8 == '\0') goto LAB_001844f4;
          pIVar14 = (this->y).var;
          iVar6 = (pIVar14->max).v;
          pIVar12 = pIVar1->var;
          iVar8 = (pIVar12->max).v;
        }
        if (iVar6 < iVar8) {
          if (so.lazy == true) {
            LVar5 = BoolView::getValLit(this_00);
            expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                         super__Vector_impl_data._M_start._4_4_,LVar5.x);
            iVar8 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
            expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(iVar8,expl.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                               _M_impl.super__Vector_impl_data._M_start._0_4_);
            iVar8 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
            expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)CONCAT44(expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                          .super__Vector_impl_data._M_finish._4_4_,iVar8);
            __l_05._M_len = 3;
            __l_05._M_array = (iterator)&expl;
            std::vector<Lit,_std::allocator<Lit>_>::vector
                      ((vector<Lit,_std::allocator<Lit>_> *)&local_90,__l_05,
                       (allocator_type *)&new_m);
            pCVar10 = Reason_new((vector<Lit,_std::allocator<Lit>_> *)&local_90);
            std::_Vector_base<Lit,_std::allocator<Lit>_>::~_Vector_base(&local_90);
            pIVar12 = pIVar1->var;
          }
          else {
            pCVar10 = (Clause *)0x0;
          }
          iVar8 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[0xf])
                            (pIVar12,(long)iVar6,pCVar10,1);
          if ((char)iVar8 == '\0') goto LAB_001844f4;
          pIVar14 = (this->y).var;
          iVar6 = (pIVar14->max).v;
        }
        unaff_R15 = (Clause *)0x1;
        if (((pIVar14->min).v == iVar6) && ((pIVar1->var->min).v == (pIVar1->var->max).v)) {
          Tchar::operator=(&(this->super_Propagator).satisfied,'\x01');
        }
        goto LAB_001844f7;
      }
      if (so.lazy == true) {
        LVar5 = BoolView::getValLit(this_00);
        expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)CONCAT44(expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,LVar5.x);
        iVar6 = (*(pIVar1->var->super_Var).super_Branching._vptr_Branching[8])();
        expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)CONCAT44(iVar6,expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                       super__Vector_impl_data._M_start._0_4_);
        iVar6 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
        expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data._M_finish
             = (pointer)CONCAT44(expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                 super__Vector_impl_data._M_finish._4_4_,iVar6);
        __l._M_len = 3;
        __l._M_array = (iterator)&expl;
        std::vector<Lit,_std::allocator<Lit>_>::vector
                  ((vector<Lit,_std::allocator<Lit>_> *)&local_48,__l,(allocator_type *)&new_m);
        pCVar10 = Reason_new((vector<Lit,_std::allocator<Lit>_> *)&local_48);
        std::_Vector_base<Lit,_std::allocator<Lit>_>::~_Vector_base(&local_48);
        pIVar14 = (this->y).var;
      }
      else {
        pCVar10 = (Clause *)0x0;
      }
      iVar8 = (*(pIVar14->super_Var).super_Branching._vptr_Branching[0xe])
                        (pIVar14,(long)iVar8,pCVar10,1);
      if ((char)iVar8 != '\0') {
        pIVar14 = (this->y).var;
        iVar6 = (pIVar14->min).v;
        pIVar12 = pIVar1->var;
        iVar8 = (pIVar12->min).v;
        goto LAB_00184154;
      }
LAB_001844f4:
      unaff_R15 = (Clause *)0x0;
      goto LAB_001844f7;
    }
    pIVar14 = (this->y).var;
    if ((pIVar14->max).v < iVar8) {
      iVar8 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
      expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,iVar8);
      iVar8 = (*(pIVar1->var->super_Var).super_Branching._vptr_Branching[8])();
      expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(iVar8,expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                   super__Vector_impl_data._M_start._0_4_);
      iVar8 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                             super__Vector_impl_data._M_finish._4_4_,iVar8);
      this_01 = &local_a8;
    }
    else {
      unaff_R15 = (Clause *)0x1;
      if ((pIVar14->min).v <= (pIVar12->max).v) goto LAB_001844f7;
      iVar8 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
      expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,iVar8);
      iVar8 = (*(pIVar1->var->super_Var).super_Branching._vptr_Branching[9])();
      expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(iVar8,expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                   super__Vector_impl_data._M_start._0_4_);
      iVar8 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(expl.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                             super__Vector_impl_data._M_finish._4_4_,iVar8);
      this_01 = &local_c0;
    }
    __l_02._M_len = 3;
    __l_02._M_array = (iterator)&expl;
    std::vector<Lit,_std::allocator<Lit>_>::vector
              ((vector<Lit,_std::allocator<Lit>_> *)this_01,__l_02,(allocator_type *)&new_m);
    r_00._pt = Reason_new((vector<Lit,_std::allocator<Lit>_> *)this_01);
    std::_Vector_base<Lit,_std::allocator<Lit>_>::~_Vector_base(this_01);
  }
  bVar3 = BoolView::setVal(this_00,false,(Reason)r_00);
  unaff_R15 = (Clause *)(ulong)bVar3;
LAB_001844f7:
  return (bool)((byte)unaff_R15 & 1);
}

Assistant:

bool propagate() override {
		if (b.isFixed() && b.isFalse()) {
			satisfied = true;
			return true;
		}

		// x is out of bounds
		if ((is_fixed != 0) && (fixed_index < 0 || fixed_index >= static_cast<int>(a.size()))) {
			return b.setVal(false, x.getValLit());
		}

		// y = a[fixed_index]
		if (is_fixed != 0) {
			assert(x.getVal() == fixed_index);
			const IntView<W>& f = a[fixed_index];
			if (b.isFixed()) {
				setDom(y, setMin, f.getMin(), Reason_new({b.getValLit(), f.getMinLit(), x.getValLit()}));
				setDom(f, setMin, y.getMin(), Reason_new({b.getValLit(), y.getMinLit(), x.getValLit()}));
				setDom(y, setMax, f.getMax(), Reason_new({b.getValLit(), f.getMaxLit(), x.getValLit()}));
				setDom(f, setMax, y.getMax(), Reason_new({b.getValLit(), y.getMaxLit(), x.getValLit()}));
				if (y.isFixed() && f.isFixed()) {
					satisfied = true;
				}
			} else if (f.getMin() > y.getMax()) {
				Clause* r = Reason_new({x.getValLit(), f.getMinLit(), y.getMaxLit()});
				return b.setVal(false, r);
			} else if (f.getMax() < y.getMin()) {
				Clause* r = Reason_new({x.getValLit(), f.getMaxLit(), y.getMinLit()});
				return b.setVal(false, r);
			}
			return true;
		}

		if (b.isFixed()) {
			for (unsigned int i = 0; i < a.size(); i++) {
				if (!x.indomain(i)) {
					continue;
				}
				if (y.getMax() < a[i].getMin()) {
					Clause* r = Reason_new({b.getValLit(), a[i].getMinLit(), y.getMaxLit()});
					setDom(x, remVal, i, r);
				}
				if (y.getMin() > a[i].getMax()) {
					Clause* r = Reason_new({b.getValLit(), a[i].getMaxLit(), y.getMinLit()});
					setDom(x, remVal, i, r);
				}
			}
		} else {
			std::vector<Lit> expl;
			bool push_min = false;
			bool push_max = false;
			unsigned int i = 0;
			while (i <= a.size()) {
				if (!x.indomain(i)) {
					expl.push_back(x.getLit(i, LR_EQ));
				} else if (y.getMax() < a[i].getMin()) {
					if (!push_max) {
						expl.push_back(y.getMaxLit());
						push_max = true;
					}
					expl.push_back(a[i].getMinLit());
				} else if (y.getMin() > a[i].getMax()) {
					if (!push_min) {
						expl.push_back(y.getMinLit());
						push_min = true;
					}
					expl.push_back(a[i].getMaxLit());
				} else {
					break;
				}
				i++;
			}
			if (i > x.getMax()) {
				Clause* r = Reason_new(expl);
				return b.setVal(false, r);
			}
		}

		if (no_min_support) {
			const int64_t old_m = y.getMin();
			int64_t new_m = INT64_MAX;
			int best = -1;
			for (unsigned int i = 0; i < a.size(); i++) {
				if (!x.indomain(i)) {
					continue;
				}
				const int64_t cur_m = a[i].getMin();
				if (cur_m < new_m) {
					best = i;
					new_m = cur_m;
					if (cur_m <= old_m) {
						break;
					}
				}
			}
			min_support = best;
			if (y.setMinNotR(new_m)) {
				auto reason = [&] {
					Clause* r = nullptr;
					if (so.lazy) {
						r = Reason_new(a.size() + 2);
						// Finesse lower bounds
						for (unsigned int i = 0; i < a.size(); i++) {
							(*r)[i + 2] = x.indomain(i) ? a[i].getFMinLit(new_m) : x.getLit(i, LR_EQ);
						}
					}
					return r;
				};
				if (b.isFixed()) {
					Clause* r = reason();
					(*r)[1] = b.getValLit();
					if (!y.setMin(new_m, r)) {
						return false;
					}
				} else if (y.getMax() < new_m) {
					Clause* r = reason();
					(*r)[1] = y.getMaxLit();
					return b.setVal(false, r);
				}
			}
			no_min_support = false;
		}

		if (no_max_support) {
			const int64_t old_m = y.getMax();
			int64_t new_m = INT_MIN;
			int best = -1;
			for (unsigned int i = 0; i < a.size(); i++) {
				if (!x.indomain(i)) {
					continue;
				}
				const int64_t cur_m = a[i].getMax();
				if (cur_m > new_m) {
					best = i;
					new_m = cur_m;
					if (cur_m >= old_m) {
						break;
					}
				}
			}
			max_support = best;
			if (y.setMaxNotR(new_m)) {
				auto reason = [&] {
					Clause* r = nullptr;
					if (so.lazy) {
						r = Reason_new(a.size() + 2);
						// Finesse upper bounds
						for (unsigned int i = 0; i < a.size(); i++) {
							(*r)[i + 2] = x.indomain(i) ? a[i].getFMaxLit(new_m) : x.getLit(i, LR_EQ);
						}
					}
					return r;
				};
				if (b.isFixed()) {
					Clause* r = reason();
					(*r)[1] = b.getValLit();
					if (!y.setMax(new_m, r)) {
						return false;
					}
				} else if (y.getMin() > new_m) {
					Clause* r = reason();
					(*r)[1] = y.getMinLit();
					return b.setVal(false, r);
				}
			}
			no_max_support = false;
		}

		return true;
	}